

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManDfsForCrossCut_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                        ,0x327,
                        "void Gia_ManDfsForCrossCut_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        pGVar2 = Gia_ObjFanin0(pObj);
        pGVar2->Value = pGVar2->Value + 1;
        pGVar2 = Gia_ObjFanin1(pObj);
        pGVar2->Value = pGVar2->Value + 1;
        pGVar2 = Gia_ObjFanin0(pObj);
        Gia_ManDfsForCrossCut_rec(p,pGVar2,vNodes);
        pGVar2 = Gia_ObjFanin1(pObj);
        Gia_ManDfsForCrossCut_rec(p,pGVar2,vNodes);
        iVar1 = Gia_ObjId(p,pObj);
        Vec_IntPush(vNodes,iVar1);
      }
      else {
        pGVar2 = Gia_ObjFanin0(pObj);
        pGVar2->Value = pGVar2->Value + 1;
        pGVar2 = Gia_ObjFanin0(pObj);
        Gia_ManDfsForCrossCut_rec(p,pGVar2,vNodes);
        iVar1 = Gia_ObjId(p,pObj);
        Vec_IntPush(vNodes,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vNodes,iVar1);
    }
  }
  return;
}

Assistant:

void Gia_ManDfsForCrossCut_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ObjFanin0(pObj)->Value++;
        Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjFanin0(pObj)->Value++;
    Gia_ObjFanin1(pObj)->Value++;
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}